

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O1

void __thiscall
chrono::ChLoadXYZnodeBodyBushing::~ChLoadXYZnodeBodyBushing(ChLoadXYZnodeBodyBushing *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_ChLoadXYZnodeBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadXYZnodeBodyBushing_00b49a18;
  p_Var1 = (this->force_dZ).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->force_dY).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->force_dX).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  ChLoadCustomMultiple::~ChLoadCustomMultiple((ChLoadCustomMultiple *)this);
  operator_delete(this,0x348);
  return;
}

Assistant:

class ChApi ChLoadXYZnodeBodyBushing : public ChLoadXYZnodeBody {
  public:
	  ChLoadXYZnodeBodyBushing   (std::shared_ptr<ChNodeXYZ> mnodeA,  ///< node to apply load 
								  std::shared_ptr<ChBody> mbodyB);   ///< body to apply load 

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadXYZnodeBodyBushing* Clone() const override { return new ChLoadXYZnodeBodyBushing(*this); }

	/// Compute the force on the nodeA, in local coordsystem of SetApplicationFrameB (the 
	/// auxiliary frame attached to body) given relative position of nodeA respect to B
    virtual void ComputeForce(const ChFrameMoving<>& rel_AB,
                               ChVector<>& loc_force) override;
	
	/// Set force as a function of displacement on X. Default was constant zero. 
	void SetFunctionForceX(std::shared_ptr<ChFunction> fx) { force_dX = fx; }

	/// Set force as a function of displacement on X. Default was constant zero. 
	void SetFunctionForceY(std::shared_ptr<ChFunction> fy) { force_dY = fy; }
	
	/// Set force as a function of displacement on X. Default was constant zero. 
	void SetFunctionForceZ(std::shared_ptr<ChFunction> fz) { force_dZ = fz; }

	/// Set xyz constant damping coefficients [Ns/m] along the three directions xyz, assuming
	/// local xyz directions of the frame attached to body via SetApplicationFrameB.
    void SetDamping(const ChVector<> mdamping) { R = mdamping; }
    ChVector<> GetDamping() const { return R; }

	/// Use this to enable the stiff force computation (i.e. it enables the
	/// automated computation of the jacobian by numerical differentiation to 
	/// elp the convergence of implicit integrators, but adding CPU overhead).
	void SetStiff(bool ms) { this->is_stiff = ms; }

  protected:
	  std::shared_ptr<ChFunction> force_dX;
	  std::shared_ptr<ChFunction> force_dY;
	  std::shared_ptr<ChFunction> force_dZ;
	  
	  ChVector<> R;

	  bool is_stiff;

	  virtual bool IsStiff() override { return is_stiff; }
}